

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O3

void test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>
               (unsigned_long_long num1,_func_int_char_ptr_ptr_long_ptr *read_f,bool is_ok)

{
  mp_type mVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  byte *pbVar7;
  byte bVar8;
  code *pcVar9;
  char (*pacVar10) [16];
  char (*pacVar11) [16];
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  float fVar12;
  uint extraout_EDX_01;
  double dVar13;
  char *pcVar14;
  undefined8 *puVar15;
  char *pcVar16;
  byte *pbVar17;
  char *pcVar18;
  ulong uVar19;
  char cVar20;
  char *pcVar21;
  char *pcVar22;
  ulong uVar23;
  undefined8 uVar24;
  char *pcVar25;
  undefined8 *puVar26;
  char *pcVar27;
  undefined *puVar28;
  long lVar29;
  undefined1 *__maxlen;
  bool bVar30;
  undefined1 auVar31 [16];
  char mp_nums [16] [16];
  char str [256];
  double dStack_e20;
  undefined1 *puStack_e18;
  char acStack_e10 [256];
  undefined1 uStack_d10;
  undefined8 uStack_d0f;
  undefined1 auStack_d07 [255];
  char (*pacStack_c08) [16];
  undefined8 uStack_c00;
  undefined *puStack_bf8;
  code *pcStack_bf0;
  double dStack_be8;
  byte *pbStack_be0;
  char acStack_bd8 [256];
  byte abStack_ad8 [16];
  byte abStack_ac8 [248];
  long lStack_9d0;
  ulong uStack_9c8;
  char *pcStack_9c0;
  char *pcStack_9b8;
  char *pcStack_9b0;
  code *pcStack_9a8;
  char (*pacStack_9a0) [16];
  char *pcStack_998;
  float fStack_990;
  undefined4 uStack_98c;
  double dStack_988;
  double dStack_980;
  char (*pacStack_978) [16];
  char acStack_970 [256];
  byte bStack_870;
  undefined8 uStack_86f;
  char acStack_867 [255];
  long lStack_768;
  ulong uStack_760;
  char *pcStack_758;
  char *pcStack_750;
  char *pcStack_748;
  code *pcStack_740;
  char (*pacStack_738) [16];
  char *pcStack_730;
  float fStack_728;
  undefined4 uStack_724;
  double dStack_720;
  double dStack_718;
  code *pcStack_710;
  byte bStack_708;
  undefined8 uStack_707;
  char acStack_6ff [247];
  char acStack_608 [256];
  undefined1 auStack_508 [8];
  undefined8 *puStack_500;
  ulong uStack_4f8;
  undefined8 *puStack_4f0;
  long lStack_4e8;
  undefined1 *puStack_4e0;
  code *pcStack_4d8;
  code *pcStack_4d0;
  float fStack_4c4;
  double dStack_4c0;
  double dStack_4b8;
  undefined8 *puStack_4b0;
  code *pcStack_4a8;
  byte bStack_4a0;
  undefined1 auStack_49f [2];
  undefined1 auStack_49d [6];
  undefined8 auStack_497 [30];
  char acStack_3a0 [256];
  undefined1 auStack_2a0 [8];
  char *pcStack_298;
  char *pcStack_290;
  char *pcStack_288;
  char *pcStack_280;
  long lStack_278;
  code *pcStack_270;
  float local_25c;
  unsigned_long_long local_258;
  undefined4 local_24c;
  double local_248;
  double dStack_240;
  byte local_238;
  undefined8 local_237;
  char local_22f [247];
  char local_138 [256];
  undefined1 local_38 [8];
  
  local_24c = SUB84(read_f,0);
  builtin_strncpy(local_138,"typed read of ",0xf);
  pcStack_270 = (code *)0x138151;
  local_258 = num1;
  iVar2 = snprintf(local_138 + 0xe,0xf2,"%llu",num1);
  pcVar22 = local_138 + (long)iVar2 + 0xe;
  pcStack_270 = (code *)0x138175;
  iVar2 = snprintf(pcVar22,(size_t)(local_38 + -(long)pcVar22)," into ");
  pcStack_270 = (code *)0x138194;
  snprintf(pcVar22 + iVar2,(size_t)(local_38 + -(long)(pcVar22 + iVar2)),"int%zu_t",0x40);
  pcStack_270 = (code *)0x1381a3;
  _space((FILE *)_stdout);
  pcStack_270 = (code *)0x1381bc;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (code *)0x1381cc;
  fputs(local_138,_stdout);
  pcStack_270 = (code *)0x1381d9;
  fputc(10,_stdout);
  pacVar11 = (char (*) [16])&local_238;
  pcStack_270 = (code *)0x1381e6;
  pcVar18 = (char *)num1;
  uVar3 = test_encode_uint_all_sizes(pacVar11,num1);
  if (-1 < (long)num1) {
    pacVar11 = (char (*) [16])(&local_238 + (long)(int)uVar3 * 0x10);
    pcVar18 = (char *)0x7fffffffffffffff;
    pcStack_270 = (code *)0x13820b;
    iVar2 = test_encode_int_all_sizes(pacVar11,0x7fffffffffffffff);
    uVar3 = uVar3 + iVar2;
  }
  if (0 < (int)uVar3) {
    local_25c = (float)local_258;
    auVar31._8_4_ = (int)(local_258 >> 0x20);
    auVar31._0_8_ = local_258;
    auVar31._12_4_ = 0x45300000;
    dStack_240 = auVar31._8_8_ - 1.9342813113834067e+25;
    local_248 = dStack_240 + ((double)CONCAT44(0x43300000,(int)local_258) - 4503599627370496.0);
    pcVar14 = (char *)(ulong)uVar3;
    pcVar25 = (char *)((long)&local_237 + 1);
    lVar29 = 0;
    do {
      lVar6 = lVar29 * 0x10;
      pcVar21 = pcVar25 + -2;
      bVar8 = pcVar25[-2];
      uVar23 = (ulong)bVar8;
      uVar19 = (ulong)(char)bVar8;
      mVar1 = mp_type_hint[uVar23];
      if (mVar1 != MP_UINT) {
        if (mVar1 == MP_FLOAT) {
          if (bVar8 != 0xca) {
LAB_001385f4:
            pcStack_270 = (code *)0x138613;
            __assert_fail("c == 0xca",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                          ,0x97e,"float mp_decode_float(const char **)");
          }
          uVar3 = *(uint *)(pcVar25 + -1);
          fVar12 = (float)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                          uVar3 << 0x18);
          if ((fVar12 == local_25c) && (!NAN(fVar12) && !NAN(local_25c))) {
            pcVar22 = pcVar25 + 3;
            goto LAB_0013837a;
          }
          pcStack_270 = (code *)0x138618;
          test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_00138618:
          pcStack_270 = (code *)0x13861d;
          test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
          goto LAB_0013861d;
        }
        if (mVar1 == MP_INT) {
          switch(bVar8) {
          case 0xd0:
            uVar23 = (ulong)pcVar25[-1];
            pcVar18 = (char *)&switchD_001382d0::switchdataD_00140dbc;
            pcVar22 = pcVar25;
            break;
          case 0xd1:
            uVar23 = (ulong)(short)(*(ushort *)(pcVar25 + -1) << 8 | *(ushort *)(pcVar25 + -1) >> 8)
            ;
            pcVar18 = (char *)&switchD_001382d0::switchdataD_00140dbc;
            pcVar22 = local_22f + lVar6 + -6;
            break;
          case 0xd2:
            uVar3 = *(uint *)(pcVar25 + -1);
            uVar23 = (ulong)(int)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                 uVar3 << 0x18);
            pcVar18 = (char *)&switchD_001382d0::switchdataD_00140dbc;
            pcVar22 = local_22f + lVar6 + -4;
            break;
          case 0xd3:
            uVar23 = *(ulong *)(pcVar25 + -1);
            uVar23 = uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
                     (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
                     (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 |
                     (uVar23 & 0xff00) << 0x28 | uVar23 << 0x38;
            pcVar18 = (char *)&switchD_001382d0::switchdataD_00140dbc;
            pcVar22 = local_22f + lVar6;
            break;
          default:
            if (bVar8 < 0xe0) {
              pcStack_270 = (code *)0x1385c6;
              test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
              goto LAB_001385c6;
            }
            uVar23 = uVar19;
            pcVar22 = local_22f + lVar6 + -8;
          }
          if (uVar23 != local_258) goto LAB_00138618;
          goto LAB_0013840f;
        }
        if (bVar8 != 0xcb) goto LAB_001385d0;
        uVar23 = *(ulong *)(pcVar25 + -1);
        dVar13 = (double)(uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
                          (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
                          (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 |
                          (uVar23 & 0xff00) << 0x28 | uVar23 << 0x38);
        if ((dVar13 != local_248) || (NAN(dVar13) || NAN(local_248))) {
          pcStack_270 = (code *)0x1385f4;
          test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
          goto LAB_001385f4;
        }
        pcVar22 = local_22f + lVar6;
        goto LAB_0013837a;
      }
      switch(bVar8) {
      case 0xcc:
        uVar23 = (ulong)(byte)pcVar25[-1];
        pcVar18 = (char *)&switchD_00138333::switchdataD_00140dac;
        pcVar22 = pcVar25;
        break;
      case 0xcd:
        uVar23 = (ulong)(ushort)(*(ushort *)(pcVar25 + -1) << 8 | *(ushort *)(pcVar25 + -1) >> 8);
        pcVar18 = (char *)&switchD_00138333::switchdataD_00140dac;
        pcVar22 = local_22f + lVar6 + -6;
        break;
      case 0xce:
        uVar3 = *(uint *)(pcVar25 + -1);
        uVar23 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                        uVar3 << 0x18);
        pcVar18 = (char *)&switchD_00138333::switchdataD_00140dac;
        pcVar22 = local_22f + lVar6 + -4;
        break;
      case 0xcf:
        uVar23 = *(ulong *)(pcVar25 + -1);
        uVar23 = uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
                 (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
                 (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 |
                 (uVar23 & 0xff00) << 0x28 | uVar23 << 0x38;
        pcVar18 = (char *)&switchD_00138333::switchdataD_00140dac;
        pcVar22 = local_22f + lVar6;
        break;
      default:
        if (-1 < (char)bVar8) {
          pcVar22 = local_22f + lVar6 + -8;
          break;
        }
LAB_001385c6:
        pcStack_270 = (code *)0x1385cb;
        test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
        goto LAB_001385cb;
      }
      if (uVar23 != local_258) {
LAB_0013861d:
        pcStack_270 = test_read_num<double,int,int(*)(char_const**,double*)>;
        test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
        iVar2 = (int)pacVar11;
        builtin_strncpy(acStack_3a0,"typed read of ",0xf);
        pcStack_4d0 = (code *)(long)iVar2;
        if (iVar2 < 0) {
          pcVar21 = "%lld";
          pcVar9 = pcStack_4d0;
        }
        else {
          pcVar21 = "%llu";
          pcVar9 = (code *)((ulong)pacVar11 & 0xffffffff);
        }
        pcStack_4d8 = (code *)0x1386a4;
        pcStack_4a8 = (code *)pcVar18;
        pcStack_298 = pcVar14;
        pcStack_290 = pcVar22;
        pcStack_288 = pcVar25;
        pcStack_280 = (char *)num1;
        lStack_278 = lVar29;
        pcStack_270 = (code *)(&local_238 + lVar6);
        iVar4 = snprintf(acStack_3a0 + 0xe,0xf2,pcVar21,pcVar9);
        pcVar22 = acStack_3a0 + 0xe + iVar4;
        iVar5 = 0;
        pcStack_4d8 = (code *)0x1386c3;
        iVar4 = snprintf(pcVar22,(size_t)(auStack_2a0 + -(long)pcVar22)," into ");
        __maxlen = auStack_2a0 + -(long)(pcVar22 + iVar4);
        pcStack_4d8 = (code *)0x1386dd;
        snprintf(pcVar22 + iVar4,(size_t)__maxlen,"double");
        pcStack_4d8 = (code *)0x1386ec;
        _space((FILE *)_stdout);
        pcStack_4d8 = (code *)0x138705;
        fwrite("# ",2,1,_stdout);
        pcStack_4d8 = (code *)0x138715;
        fputs(acStack_3a0,_stdout);
        pcStack_4d8 = (code *)0x138722;
        fputc(10,_stdout);
        if (-1 < iVar2) {
          pcStack_4d8 = (code *)0x138733;
          iVar5 = test_encode_uint_all_sizes
                            ((char (*) [16])&bStack_4a0,(uint64_t)((ulong)pacVar11 & 0xffffffff));
        }
        pcVar18 = (char *)(&bStack_4a0 + (long)iVar5 * 0x10);
        pcStack_4d8 = (code *)0x138751;
        pcVar22 = (char *)pcStack_4d0;
        iVar4 = test_encode_int_all_sizes((char (*) [16])pcVar18,(int64_t)pcStack_4d0);
        uVar3 = iVar5 + iVar4;
        if (uVar3 == 0 || SCARRY4(iVar5,iVar4) != (int)uVar3 < 0) {
          return;
        }
        fStack_4c4 = (float)iVar2;
        dStack_4c0 = (double)iVar2;
        uVar23 = (ulong)uVar3;
        puVar26 = (undefined8 *)(auStack_49f + 1);
        pcVar25 = 
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
        lVar29 = 0;
        goto LAB_00138782;
      }
LAB_0013840f:
      switch(bVar8) {
      case 0xcc:
        uVar19 = (ulong)(byte)pcVar25[-1];
        goto LAB_0013843d;
      case 0xcd:
        pcVar16 = local_22f + lVar6 + -6;
        uVar19 = (ulong)(ushort)(*(ushort *)(pcVar25 + -1) << 8 | *(ushort *)(pcVar25 + -1) >> 8);
        break;
      case 0xce:
        uVar3 = *(uint *)(pcVar25 + -1);
        uVar19 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                        uVar3 << 0x18);
        pcVar16 = local_22f + lVar6 + -4;
        break;
      case 0xcf:
        uVar23 = *(ulong *)(pcVar25 + -1);
        uVar19 = uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
                 (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
                 (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 |
                 (uVar23 & 0xff00) << 0x28 | uVar23 << 0x38;
        if (-1 < (long)uVar19) goto LAB_00138468;
LAB_0013837a:
        uVar19 = 0;
        iVar4 = 1;
        iVar2 = 0;
        pcVar16 = pcVar21;
        goto LAB_001384b7;
      case 0xd0:
        uVar19 = (ulong)pcVar25[-1];
LAB_0013843d:
        pcVar16 = local_22f + lVar6 + -7;
        break;
      case 0xd1:
        pcVar16 = local_22f + lVar6 + -6;
        uVar19 = (ulong)(short)(*(ushort *)(pcVar25 + -1) << 8 | *(ushort *)(pcVar25 + -1) >> 8);
        break;
      case 0xd2:
        uVar3 = *(uint *)(pcVar25 + -1);
        pcVar16 = local_22f + lVar6 + -4;
        uVar19 = (ulong)(int)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                             uVar3 << 0x18);
        break;
      case 0xd3:
        uVar23 = *(ulong *)(pcVar25 + -1);
        uVar19 = uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
                 (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
                 (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 |
                 (uVar23 & 0xff00) << 0x28 | uVar23 << 0x38;
LAB_00138468:
        pcVar16 = local_22f + lVar6;
        break;
      default:
        if ((char)bVar8 < -0x20) goto LAB_0013837a;
        pcVar16 = local_22f + lVar6 + -8;
      }
      iVar2 = 1;
      iVar4 = 0;
LAB_001384b7:
      if ((char)local_24c == '\0') {
        pcVar27 = 
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
        pcStack_270 = (code *)0x138579;
        _ok(iVar4,"rc == -1",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar8);
        pacVar11 = (char (*) [16])(ulong)(pcVar21 == pcVar16);
        pcVar18 = "mp_num_pos2 == mp_nums[i]";
        pcStack_270 = (code *)0x13859f;
        _ok((uint)(pcVar21 == pcVar16),"mp_num_pos2 == mp_nums[i]",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x738,"check position");
      }
      else {
        pcStack_270 = (code *)0x1384ef;
        _ok(iVar2,"rc == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar8);
        pcVar21 = 
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
        pcStack_270 = (code *)0x13851c;
        _ok((uint)(pcVar22 == pcVar16),"mp_num_pos1 == mp_num_pos2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73c,"check position");
        if ((long)uVar19 < 0) {
LAB_001385cb:
          pcStack_270 = (code *)0x1385d0;
          test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_001385d0:
          pcStack_270 = (code *)0x1385ef;
          __assert_fail("c == 0xcb",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                        ,0x987,"double mp_decode_double(const char **)");
        }
        pacVar11 = (char (*) [16])(ulong)(uVar19 == local_258);
        pcVar18 = "(uint64_t)num1 == (uint64_t)num2";
        pcStack_270 = (code *)0x13854d;
        _ok((uint)(uVar19 == local_258),"(uint64_t)num1 == (uint64_t)num2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x743,"check int number");
        pcVar27 = pcVar14;
      }
      lVar29 = lVar29 + 1;
      pcVar25 = pcVar25 + 0x10;
      pcVar14 = pcVar14 + -1;
      pcVar22 = pcVar21;
      num1 = (unsigned_long_long)pcVar27;
    } while (pcVar14 != (char *)0x0);
  }
  return;
LAB_00138782:
  lVar6 = lVar29 * 0x10;
  bVar8 = *(byte *)((long)puVar26 + -2);
  pcVar9 = (code *)(ulong)bVar8;
  mVar1 = mp_type_hint[(long)pcVar9];
  puVar15 = puVar26;
  if (mVar1 == MP_UINT) {
    switch(bVar8) {
    case 0xcc:
      pcVar9 = (code *)(ulong)*(byte *)((long)puVar26 + -1);
      break;
    case 0xcd:
      pcVar9 = (code *)(ulong)(ushort)(*(ushort *)((long)puVar26 + -1) << 8 |
                                      *(ushort *)((long)puVar26 + -1) >> 8);
      puVar15 = (undefined8 *)((long)auStack_497 + lVar6 + -6);
      break;
    case 0xce:
      uVar3 = *(uint *)((long)puVar26 + -1);
      pcVar9 = (code *)(ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                              uVar3 << 0x18);
      puVar15 = (undefined8 *)((long)auStack_497 + lVar6 + -4);
      break;
    case 0xcf:
      uVar19 = *(ulong *)((long)puVar26 + -1);
      pcVar9 = (code *)(uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                        (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                        (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                        (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38);
      puVar15 = auStack_497 + lVar29 * 2;
      break;
    default:
      if ((char)bVar8 < '\0') {
LAB_001389dc:
        pcStack_4d8 = (code *)0x1389e1;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001389e1:
        pcStack_4d8 = (code *)0x1389e6;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001389e6:
        pcStack_4d8 = (code *)0x138a05;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      puVar15 = auStack_497 + lVar29 * 2 + -1;
    }
    if (pcVar9 != pcStack_4d0) {
      pcStack_4d8 = (code *)0x138a2e;
      test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_00138a2e:
      pcStack_4d8 = test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      pcStack_4d8 = (code *)0x1411a4;
      builtin_strncpy(acStack_608,"typed read of ",0xf);
      pcStack_740 = (code *)0x138a9a;
      uStack_724 = extraout_EDX;
      pcStack_710 = (code *)pcVar22;
      puStack_500 = puVar15;
      uStack_4f8 = uVar23;
      puStack_4f0 = puVar26;
      lStack_4e8 = lVar29;
      puStack_4e0 = __maxlen;
      iVar2 = snprintf(acStack_608 + 0xe,0xf2,"%llu",pcVar18);
      pcVar22 = acStack_608 + (long)iVar2 + 0xe;
      pcStack_740 = (code *)0x138abe;
      iVar2 = snprintf(pcVar22,(size_t)(auStack_508 + -(long)pcVar22)," into ");
      pcStack_740 = (code *)0x138ad8;
      snprintf(pcVar22 + iVar2,(size_t)(auStack_508 + -(long)(pcVar22 + iVar2)),"double");
      pcStack_740 = (code *)0x138ae7;
      _space((FILE *)_stdout);
      pcStack_740 = (code *)0x138b00;
      fwrite("# ",2,1,_stdout);
      pcStack_740 = (code *)0x138b10;
      fputs(acStack_608,_stdout);
      pcStack_740 = (code *)0x138b1d;
      fputc(10,_stdout);
      pcStack_740 = (code *)0x138b2a;
      iVar2 = test_encode_uint_all_sizes((char (*) [16])&bStack_708,(uint64_t)pcVar18);
      pacVar11 = (char (*) [16])(&bStack_708 + (long)iVar2 * 0x10);
      pcStack_740 = (code *)0x138b48;
      pacStack_738 = (char (*) [16])pcVar18;
      iVar4 = test_encode_int_all_sizes(pacVar11,(int64_t)pcVar18);
      uVar3 = iVar2 + iVar4;
      if (uVar3 == 0 || SCARRY4(iVar2,iVar4) != (int)uVar3 < 0) {
        return;
      }
      fStack_728 = (float)(long)pacStack_738;
      dStack_720 = (double)(long)pacStack_738;
      uVar23 = (ulong)uVar3;
      pcVar14 = (char *)((long)&uStack_707 + 1);
      lVar29 = 0;
      goto LAB_00138b77;
    }
  }
  else if (mVar1 == MP_FLOAT) {
    if (bVar8 != 0xca) {
LAB_00138a0a:
      pcStack_4d8 = (code *)0x138a29;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar3 = *(uint *)((long)puVar26 + -1);
    fVar12 = (float)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18
                    );
    if ((fVar12 != fStack_4c4) || (NAN(fVar12) || NAN(fStack_4c4))) goto LAB_001389e1;
    puVar15 = (undefined8 *)((long)puVar26 + 3);
  }
  else if (mVar1 == MP_INT) {
    pcVar9 = (code *)(long)(char)bVar8;
    switch(bVar8) {
    case 0xd0:
      pcVar9 = (code *)(long)*(char *)((long)puVar26 + -1);
      pcVar22 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    case 0xd1:
      pcVar9 = (code *)(long)(short)(*(ushort *)((long)puVar26 + -1) << 8 |
                                    *(ushort *)((long)puVar26 + -1) >> 8);
      puVar15 = (undefined8 *)((long)auStack_497 + lVar6 + -6);
      pcVar22 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    case 0xd2:
      uVar3 = *(uint *)((long)puVar26 + -1);
      pcVar9 = (code *)(long)(int)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                  uVar3 << 0x18);
      puVar15 = (undefined8 *)((long)auStack_497 + lVar6 + -4);
      pcVar22 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    case 0xd3:
      uVar19 = *(ulong *)((long)puVar26 + -1);
      pcVar9 = (code *)(uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                        (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                        (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                        (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38);
      puVar15 = auStack_497 + lVar29 * 2;
      pcVar22 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    default:
      if (bVar8 < 0xe0) {
        pcStack_4d8 = (code *)0x1389dc;
        test_read_num<double,int,int(*)(char_const**,double*)>();
        goto LAB_001389dc;
      }
      puVar15 = auStack_497 + lVar29 * 2 + -1;
    }
    if (pcVar9 != pcStack_4d0) goto LAB_00138a2e;
  }
  else {
    if (bVar8 != 0xcb) goto LAB_001389e6;
    uVar19 = *(ulong *)((long)puVar26 + -1);
    dVar13 = (double)(uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                      (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                      (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                      (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38);
    if ((dVar13 != dStack_4c0) || (NAN(dVar13) || NAN(dStack_4c0))) {
      pcStack_4d8 = (code *)0x138a0a;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      goto LAB_00138a0a;
    }
    puVar15 = auStack_497 + lVar29 * 2;
  }
  puStack_4b0 = (undefined8 *)((long)puVar26 + -2);
  __maxlen = (undefined1 *)(ulong)(uint)(int)(char)bVar8;
  dStack_4b8 = 0.0;
  pcStack_4d8 = (code *)0x138922;
  iVar2 = (*pcStack_4a8)(&puStack_4b0,&dStack_4b8);
  pcStack_4d8 = (code *)0x13894a;
  _ok((uint)(iVar2 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",__maxlen);
  pcStack_4d8 = (code *)0x138972;
  _ok((uint)(puVar15 == puStack_4b0),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar30 = ABS(dStack_4c0 - dStack_4b8) < 1e-15;
  pcVar18 = (char *)(ulong)bVar30;
  pcVar22 = "double_eq(num1, num2)";
  pcStack_4d8 = (code *)0x1389b5;
  _ok((uint)bVar30,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  lVar29 = lVar29 + 1;
  puVar26 = puVar26 + 2;
  uVar23 = uVar23 - 1;
  if (uVar23 == 0) {
    return;
  }
  goto LAB_00138782;
LAB_00138b77:
  lVar6 = lVar29 * 0x10;
  bVar8 = pcVar14[-2];
  pacVar10 = (char (*) [16])(ulong)bVar8;
  mVar1 = mp_type_hint[(long)pacVar10];
  pcVar21 = pcVar14;
  if (mVar1 == MP_UINT) {
    switch(bVar8) {
    case 0xcc:
      pacVar10 = (char (*) [16])(ulong)(byte)pcVar14[-1];
      break;
    case 0xcd:
      pacVar10 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pcVar14 + -1) << 8 | *(ushort *)(pcVar14 + -1) >> 8);
      pcVar21 = acStack_6ff + lVar6 + -6;
      break;
    case 0xce:
      uVar3 = *(uint *)(pcVar14 + -1);
      pacVar10 = (char (*) [16])
                 (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                        uVar3 << 0x18);
      pcVar21 = acStack_6ff + lVar6 + -4;
      break;
    case 0xcf:
      uVar19 = *(ulong *)(pcVar14 + -1);
      pacVar10 = (char (*) [16])
                 (uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                  (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                  (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                  (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38);
      pcVar21 = acStack_6ff + lVar29 * 0x10;
      break;
    default:
      if ((char)bVar8 < '\0') {
LAB_00138e36:
        pcStack_740 = (code *)0x138e3b;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e3b:
        pcStack_740 = (code *)0x138e40;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e40:
        pcStack_740 = (code *)0x138e5f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar21 = acStack_6ff + (lVar29 * 2 + -1) * 8;
    }
    if (pacVar10 != pacStack_738) {
      pcStack_740 = (code *)0x138e88;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e88:
      pcStack_740 = test_read_num<double,long_long,int(*)(char_const**,double*)>;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_970,"typed read of ",0xf);
      pcStack_9a8 = (code *)0x138ef1;
      uStack_98c = extraout_EDX_00;
      pacStack_978 = (char (*) [16])pcVar18;
      lStack_768 = lVar29;
      uStack_760 = uVar23;
      pcStack_758 = pcVar22;
      pcStack_750 = pcVar21;
      pcStack_748 = pcVar14;
      pcStack_740 = (code *)pcVar25;
      iVar2 = snprintf(acStack_970 + 0xe,0xf2,"%lld",pacVar11);
      pcVar22 = acStack_970 + (long)iVar2 + 0xe;
      pcStack_9a8 = (code *)0x138f12;
      iVar2 = snprintf(pcVar22,(size_t)(&bStack_870 + -(long)pcVar22)," into ");
      pcStack_9a8 = (code *)0x138f2c;
      snprintf(pcVar22 + iVar2,(size_t)(&bStack_870 + -(long)(pcVar22 + iVar2)),"double");
      pcStack_9a8 = (code *)0x138f3b;
      _space((FILE *)_stdout);
      pcStack_9a8 = (code *)0x138f54;
      fwrite("# ",2,1,_stdout);
      pcStack_9a8 = (code *)0x138f61;
      fputs(acStack_970,_stdout);
      pcStack_9a8 = (code *)0x138f6e;
      fputc(10,_stdout);
      pacVar10 = (char (*) [16])&bStack_870;
      pcStack_9a8 = (code *)0x138f82;
      pacStack_9a0 = pacVar11;
      uVar3 = test_encode_int_all_sizes(pacVar10,(int64_t)pacVar11);
      if ((int)uVar3 < 1) {
        return;
      }
      fStack_990 = (float)(long)pacStack_9a0;
      dStack_988 = (double)(long)pacStack_9a0;
      uVar23 = (ulong)uVar3;
      pcVar18 = (char *)((long)&uStack_86f + 1);
      lVar29 = 0;
      goto LAB_00138fb4;
    }
  }
  else if (mVar1 == MP_FLOAT) {
    if (bVar8 != 0xca) {
LAB_00138e64:
      pcStack_740 = (code *)0x138e83;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar3 = *(uint *)(pcVar14 + -1);
    fVar12 = (float)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18
                    );
    if ((fVar12 != fStack_728) || (NAN(fVar12) || NAN(fStack_728))) goto LAB_00138e3b;
    pcVar21 = pcVar14 + 3;
  }
  else if (mVar1 == MP_INT) {
    pacVar10 = (char (*) [16])(long)(char)bVar8;
    switch(bVar8) {
    case 0xd0:
      pacVar10 = (char (*) [16])(long)pcVar14[-1];
      pcVar18 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      break;
    case 0xd1:
      pacVar10 = (char (*) [16])
                 (long)(short)(*(ushort *)(pcVar14 + -1) << 8 | *(ushort *)(pcVar14 + -1) >> 8);
      pcVar18 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      pcVar21 = acStack_6ff + lVar6 + -6;
      break;
    case 0xd2:
      uVar3 = *(uint *)(pcVar14 + -1);
      pacVar10 = (char (*) [16])
                 (long)(int)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                            uVar3 << 0x18);
      pcVar18 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      pcVar21 = acStack_6ff + lVar6 + -4;
      break;
    case 0xd3:
      uVar19 = *(ulong *)(pcVar14 + -1);
      pacVar10 = (char (*) [16])
                 (uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                  (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                  (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                  (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38);
      pcVar18 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      pcVar21 = acStack_6ff + lVar29 * 0x10;
      break;
    default:
      if (bVar8 < 0xe0) {
        pcStack_740 = (code *)0x138e36;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
        goto LAB_00138e36;
      }
      pcVar21 = acStack_6ff + (lVar29 * 2 + -1) * 8;
    }
    if (pacVar10 != pacStack_738) goto LAB_00138e88;
  }
  else {
    if (bVar8 != 0xcb) goto LAB_00138e40;
    uVar19 = *(ulong *)(pcVar14 + -1);
    dVar13 = (double)(uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                      (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                      (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                      (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38);
    if ((dVar13 != dStack_720) || (NAN(dVar13) || NAN(dStack_720))) {
      pcStack_740 = (code *)0x138e64;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      goto LAB_00138e64;
    }
    pcVar21 = acStack_6ff + lVar29 * 0x10;
  }
  pcVar25 = pcVar14 + -2;
  pcVar22 = (char *)(ulong)(uint)(int)(char)bVar8;
  dStack_718 = 0.0;
  pcStack_740 = (code *)0x138d17;
  pcStack_730 = pcVar25;
  iVar2 = (*pcStack_710)(&pcStack_730,&dStack_718);
  if ((char)uStack_724 == '\0') {
    pcStack_740 = (code *)0x138de7;
    _ok((uint)(iVar2 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar22);
    bVar30 = pcVar25 == pcStack_730;
    pcVar18 = "mp_num_pos2 == mp_nums[i]";
    iVar2 = 0x738;
    pcVar21 = "check position";
  }
  else {
    pcVar25 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_740 = (code *)0x138d51;
    _ok((uint)(iVar2 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar22);
    pcStack_740 = (code *)0x138d79;
    _ok((uint)(pcVar21 == pcStack_730),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar30 = ABS(dStack_720 - dStack_718) < 1e-15;
    pcVar18 = "double_eq(num1, num2)";
    iVar2 = 0x73e;
    pcVar21 = "check float number";
  }
  pacVar11 = (char (*) [16])(ulong)bVar30;
  pcStack_740 = (code *)0x138e0f;
  _ok((uint)bVar30,pcVar18,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar2,
      pcVar21);
  lVar29 = lVar29 + 1;
  pcVar14 = pcVar14 + 0x10;
  uVar23 = uVar23 - 1;
  if (uVar23 == 0) {
    return;
  }
  goto LAB_00138b77;
LAB_00138fb4:
  lVar6 = lVar29 * 0x10;
  bVar8 = pcVar18[-2];
  pacVar11 = (char (*) [16])(ulong)bVar8;
  mVar1 = mp_type_hint[(long)pacVar11];
  pcVar14 = pcVar18;
  if (mVar1 == MP_UINT) {
    switch(bVar8) {
    case 0xcc:
      pacVar11 = (char (*) [16])(ulong)(byte)pcVar18[-1];
      break;
    case 0xcd:
      pacVar11 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pcVar18 + -1) << 8 | *(ushort *)(pcVar18 + -1) >> 8);
      pcVar14 = acStack_867 + lVar6 + -6;
      break;
    case 0xce:
      uVar3 = *(uint *)(pcVar18 + -1);
      pacVar11 = (char (*) [16])
                 (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                        uVar3 << 0x18);
      pcVar14 = acStack_867 + lVar6 + -4;
      break;
    case 0xcf:
      uVar19 = *(ulong *)(pcVar18 + -1);
      pacVar11 = (char (*) [16])
                 (uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                  (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                  (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                  (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38);
      pcVar14 = acStack_867 + lVar29 * 0x10;
      break;
    default:
      if ((char)bVar8 < '\0') {
LAB_00139276:
        pcStack_9a8 = (code *)0x13927b;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_0013927b:
        pcStack_9a8 = (code *)0x139280;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00139280:
        pcStack_9a8 = (code *)0x13929f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar14 = acStack_867 + (lVar29 * 2 + -1) * 8;
    }
    if (pacVar11 != pacStack_9a0) {
      pcStack_9a8 = (code *)0x1392c8;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_001392c8:
      pcStack_9a8 = test_read_num<double,float,int(*)(char_const**,double*)>;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_bd8,"typed read of ",0xf);
      uVar24 = CONCAT71((int7)(uVar23 >> 8),1);
      pcStack_bf0 = (code *)0x13932e;
      lStack_9d0 = lVar29;
      uStack_9c8 = uVar23;
      pcStack_9c0 = pcVar22;
      pcStack_9b8 = pcVar14;
      pcStack_9b0 = pcVar18;
      pcStack_9a8 = (code *)pcVar25;
      iVar2 = snprintf(acStack_bd8 + 0xe,0xf2,"%f",0x41590b2200000000);
      pcVar22 = acStack_bd8 + (long)iVar2 + 0xe;
      pcStack_bf0 = (code *)0x13934f;
      iVar2 = snprintf(pcVar22,(size_t)(abStack_ad8 + -(long)pcVar22)," into ");
      pcStack_bf0 = (code *)0x139369;
      snprintf(pcVar22 + iVar2,(size_t)(abStack_ad8 + -(long)(pcVar22 + iVar2)),"double");
      puVar28 = &stdout;
      pcStack_bf0 = (code *)0x139378;
      _space((FILE *)_stdout);
      pcStack_bf0 = (code *)0x139391;
      fwrite("# ",2,1,_stdout);
      pcStack_bf0 = (code *)0x13939e;
      fputs(acStack_bd8,_stdout);
      pcVar9 = (code *)0xa;
      pcStack_bf0 = (code *)0x1393ab;
      fputc(10,_stdout);
      abStack_ad8[0] = 0xca;
      abStack_ad8[1] = 0x4a;
      abStack_ad8[2] = 200;
      abStack_ad8[3] = 0x59;
      abStack_ad8[4] = 0x10;
      abStack_ac8[0] = 0xcb;
      abStack_ac8[1] = 0x41;
      abStack_ac8[2] = 0x59;
      abStack_ac8[3] = 0xb;
      abStack_ac8[4] = 0x22;
      abStack_ac8[5] = 0;
      abStack_ac8[6] = 0;
      abStack_ac8[7] = 0;
      abStack_ac8[8] = 0;
      pbVar7 = abStack_ad8;
      goto LAB_001393db;
    }
  }
  else if (mVar1 == MP_FLOAT) {
    if (bVar8 != 0xca) {
LAB_001392a4:
      pcStack_9a8 = (code *)0x1392c3;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar3 = *(uint *)(pcVar18 + -1);
    fVar12 = (float)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18
                    );
    if ((fVar12 != fStack_990) || (NAN(fVar12) || NAN(fStack_990))) goto LAB_0013927b;
    pcVar14 = pcVar18 + 3;
  }
  else if (mVar1 == MP_INT) {
    pacVar11 = (char (*) [16])(long)(char)bVar8;
    switch(bVar8) {
    case 0xd0:
      pacVar11 = (char (*) [16])(long)pcVar18[-1];
      break;
    case 0xd1:
      pacVar11 = (char (*) [16])
                 (long)(short)(*(ushort *)(pcVar18 + -1) << 8 | *(ushort *)(pcVar18 + -1) >> 8);
      pcVar14 = acStack_867 + lVar6 + -6;
      break;
    case 0xd2:
      uVar3 = *(uint *)(pcVar18 + -1);
      pacVar11 = (char (*) [16])
                 (long)(int)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                            uVar3 << 0x18);
      pcVar14 = acStack_867 + lVar6 + -4;
      break;
    case 0xd3:
      uVar19 = *(ulong *)(pcVar18 + -1);
      pacVar11 = (char (*) [16])
                 (uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                  (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                  (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                  (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38);
      pcVar14 = acStack_867 + lVar29 * 0x10;
      break;
    default:
      if (bVar8 < 0xe0) {
        pcStack_9a8 = (code *)0x139276;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
        goto LAB_00139276;
      }
      pcVar14 = acStack_867 + (lVar29 * 2 + -1) * 8;
    }
    if (pacVar11 != pacStack_9a0) goto LAB_001392c8;
  }
  else {
    if (bVar8 != 0xcb) goto LAB_00139280;
    uVar19 = *(ulong *)(pcVar18 + -1);
    dVar13 = (double)(uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                      (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                      (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                      (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38);
    if ((dVar13 != dStack_988) || (NAN(dVar13) || NAN(dStack_988))) {
      pcStack_9a8 = (code *)0x1392a4;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      goto LAB_001392a4;
    }
    pcVar14 = acStack_867 + lVar29 * 0x10;
  }
  pcVar25 = pcVar18 + -2;
  pcVar22 = (char *)(ulong)(uint)(int)(char)bVar8;
  dStack_980 = 0.0;
  pcStack_9a8 = (code *)0x139157;
  pcStack_998 = pcVar25;
  iVar2 = (*(code *)pacStack_978)(&pcStack_998,&dStack_980);
  if ((char)uStack_98c == '\0') {
    pcStack_9a8 = (code *)0x139227;
    _ok((uint)(iVar2 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar22);
    bVar30 = pcVar25 == pcStack_998;
    pcVar14 = "mp_num_pos2 == mp_nums[i]";
    iVar2 = 0x738;
    pcVar21 = "check position";
  }
  else {
    pcVar25 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_9a8 = (code *)0x139191;
    _ok((uint)(iVar2 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar22);
    pcStack_9a8 = (code *)0x1391b9;
    _ok((uint)(pcVar14 == pcStack_998),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar30 = ABS(dStack_988 - dStack_980) < 1e-15;
    pcVar14 = "double_eq(num1, num2)";
    iVar2 = 0x73e;
    pcVar21 = "check float number";
  }
  pacVar10 = (char (*) [16])(ulong)bVar30;
  pcStack_9a8 = (code *)0x13924f;
  _ok((uint)bVar30,pcVar14,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar2,
      pcVar21);
  lVar29 = lVar29 + 1;
  pcVar18 = pcVar18 + 0x10;
  uVar23 = uVar23 - 1;
  if (uVar23 == 0) {
    return;
  }
  goto LAB_00138fb4;
LAB_001393db:
  bVar8 = *pbVar7;
  uVar23 = (ulong)bVar8;
  mVar1 = mp_type_hint[uVar23];
  if (mVar1 == MP_UINT) {
    if (bVar8 == 0xce) {
      uVar3 = *(uint *)(pbVar7 + 1);
      uVar19 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                      uVar3 << 0x18);
      pbVar17 = pbVar7 + 5;
LAB_001394a6:
      if (uVar19 == 0x642c88) goto LAB_001394cd;
    }
    else {
      if (bVar8 == 0xcf) {
        uVar19 = *(ulong *)(pbVar7 + 1);
        uVar19 = uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                 (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                 (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                 (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38;
        pbVar17 = pbVar7 + 9;
        goto LAB_001394a6;
      }
      if ((1 < bVar8 - 0xcc) && ((char)bVar8 < '\0')) {
        pcStack_bf0 = (code *)0x139617;
        test_read_num<double,float,int(*)(char_const**,double*)>();
        goto LAB_00139617;
      }
    }
    pcStack_bf0 = (code *)0x1395b5;
    test_read_num<double,float,int(*)(char_const**,double*)>();
    bVar8 = (byte)uVar23;
    uVar3 = extraout_EDX_01;
LAB_001395b5:
    if ((1 < uVar3 - 0xd0) && (bVar8 < 0xe0)) {
LAB_00139617:
      pcStack_bf0 = test_read_num<double,double,int(*)(char_const**,double*)>;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_e10,"typed read of ",0xf);
      pacStack_c08 = pacVar10;
      uStack_c00 = uVar24;
      puStack_bf8 = puVar28;
      pcStack_bf0 = (code *)abStack_ac8;
      iVar2 = snprintf(acStack_e10 + 0xe,0xf2,"%lf",0xc0163851eb851eb8);
      pcVar22 = acStack_e10 + (long)iVar2 + 0xe;
      iVar2 = snprintf(pcVar22,(size_t)(&uStack_d10 + -(long)pcVar22)," into ");
      snprintf(pcVar22 + iVar2,(size_t)(&uStack_d10 + -(long)(pcVar22 + iVar2)),"double");
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fputs(acStack_e10,_stdout);
      fputc(10,_stdout);
      puStack_e18 = &uStack_d10;
      uStack_d10 = 0xcb;
      uStack_d0f = 0xb81e85eb513816c0;
      dStack_e20 = 0.0;
      iVar2 = (*pcVar9)(&puStack_e18,&dStack_e20);
      _ok((uint)(iVar2 == 0),"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",0xffffffcb);
      _ok((uint)(auStack_d07 == puStack_e18),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      _ok((uint)(ABS(-5.555 - dStack_e20) < 1e-15),"double_eq(num1, num2)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73e,"check float number");
      return;
    }
LAB_001395c5:
    pcStack_bf0 = (code *)0x1395ca;
    test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_001395ca:
    pcStack_bf0 = (code *)0x1395cf;
    test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_001395cf:
    pcStack_bf0 = (code *)0x1395ee;
    __assert_fail("c == 0xcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                  ,0x987,"double mp_decode_double(const char **)");
  }
  if (mVar1 == MP_FLOAT) {
    if (bVar8 != 0xca) {
LAB_001395f3:
      pcStack_bf0 = (code *)0x139612;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar3 = *(uint *)(pbVar7 + 1);
    fVar12 = (float)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18
                    );
    if ((fVar12 == 6.565e+06) && (!NAN(fVar12))) {
      pbVar17 = pbVar7 + 5;
      goto LAB_001394cd;
    }
    goto LAB_001395ca;
  }
  if (mVar1 == MP_INT) {
    if (bVar8 != 0xd2) {
      uVar3 = (uint)bVar8;
      if (bVar8 == 0xd3) {
        uVar23 = *(ulong *)(pbVar7 + 1);
        uVar23 = uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
                 (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
                 (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 |
                 (uVar23 & 0xff00) << 0x28 | uVar23 << 0x38;
        pbVar17 = pbVar7 + 9;
        goto LAB_001394c0;
      }
      goto LAB_001395b5;
    }
    uVar3 = *(uint *)(pbVar7 + 1);
    pbVar17 = pbVar7 + 5;
    uVar23 = (ulong)(int)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                         uVar3 << 0x18);
LAB_001394c0:
    if (uVar23 == 0x642c88) goto LAB_001394cd;
    goto LAB_001395c5;
  }
  if (bVar8 != 0xcb) goto LAB_001395cf;
  uVar23 = *(ulong *)(pbVar7 + 1);
  dVar13 = (double)(uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
                    (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
                    (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 |
                    (uVar23 & 0xff00) << 0x28 | uVar23 << 0x38);
  if ((dVar13 != 6565000.0) || (NAN(dVar13))) {
    pcStack_bf0 = (code *)0x1395f3;
    test_read_num<double,float,int(*)(char_const**,double*)>();
    goto LAB_001395f3;
  }
  pbVar17 = pbVar7 + 9;
LAB_001394cd:
  puVar28 = (undefined *)(ulong)(uint)(int)(char)bVar8;
  dStack_be8 = 0.0;
  pcStack_bf0 = (code *)0x1394e8;
  pbStack_be0 = pbVar7;
  iVar2 = (*(code *)pacVar10)(&pbStack_be0,&dStack_be8);
  pcStack_bf0 = (code *)0x139510;
  _ok((uint)(iVar2 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",puVar28);
  pcStack_bf0 = (code *)0x139538;
  _ok((uint)(pbVar17 == pbStack_be0),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar30 = ABS(6565000.0 - dStack_be8) < 1e-15;
  pcVar9 = (code *)(ulong)bVar30;
  pcStack_bf0 = (code *)0x13957c;
  _ok((uint)bVar30,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  cVar20 = (char)uVar24;
  uVar24 = 0;
  pbVar7 = abStack_ac8;
  if (cVar20 == '\0') {
    return;
  }
  goto LAB_001393db;
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}